

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O0

void __thiscall Json::StyledWriter::StyledWriter(StyledWriter *this)

{
  StyledWriter *this_local;
  
  Writer::Writer(&this->super_Writer);
  (this->super_Writer)._vptr_Writer = (_func_int **)&PTR__StyledWriter_003352e8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->childValues_);
  std::__cxx11::string::string((string *)&this->document_);
  std::__cxx11::string::string((string *)&this->indentString_);
  this->rightMargin_ = 0x4a;
  this->indentSize_ = 3;
  this->addChildValues_ = false;
  return;
}

Assistant:

StyledWriter::StyledWriter()
   : rightMargin_( 74 )
   , indentSize_( 3 )
   , addChildValues_()
{
}